

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pointer __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
::allocate(MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
           *this,size_type n,void *hint)

{
  ulong uVar1;
  Arena *this_00;
  unsigned_long uVar2;
  LogMessage *pLVar3;
  void *hint_local;
  size_type n_local;
  MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
  *this_local;
  LogFinisher local_cd [20];
  byte local_b9;
  LogMessage local_b8;
  ulong local_80;
  Arena *local_78;
  MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
  *local_70;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  Arena *local_10;
  
  if (this->arena_ == (Arena *)0x0) {
    this_local = (MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
                  *)operator_new(n * 0x30);
  }
  else {
    local_78 = this->arena_;
    local_80 = n * 0x30;
    uVar2 = std::numeric_limits<unsigned_long>::max();
    local_b9 = 0;
    if (uVar2 < n * 0x30) {
      internal::LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/arena.h"
                 ,0x1c6);
      local_b9 = 1;
      pLVar3 = internal::LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=(local_cd,pLVar3);
    }
    if ((local_b9 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_b8);
    }
    this_00 = local_78;
    uVar1 = local_80;
    if (local_78 == (Arena *)0x0) {
      local_70 = (MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
                  *)operator_new__(local_80);
    }
    else {
      local_10 = local_78;
      local_18 = local_80;
      uVar2 = std::numeric_limits<unsigned_long>::max();
      local_51 = 0;
      if (uVar2 < uVar1) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/arena.h"
                   ,0x28e);
        local_51 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                           );
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3,"Requested size is too large to fit into size_t.");
        internal::LogFinisher::operator=(local_65,pLVar3);
      }
      if ((local_51 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_50);
      }
      local_70 = (MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::Node>
                  *)Arena::AllocateAligned(this_00,(type_info *)&unsigned_char::typeinfo,local_18);
    }
    this_local = local_70;
  }
  return (pointer)this_local;
}

Assistant:

pointer allocate(size_type n, const void* hint = 0) {
      // If arena is not given, malloc needs to be called which doesn't
      // construct element object.
      if (arena_ == NULL) {
        return static_cast<pointer>(::operator new(n * sizeof(value_type)));
      } else {
        return reinterpret_cast<pointer>(
            Arena::CreateArray<uint8>(arena_, n * sizeof(value_type)));
      }
    }